

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

bool __thiscall roaring::Roaring64Map::operator==(Roaring64Map *this,Roaring64Map *r)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  pointer ppVar4;
  Roaring *rhs_map;
  Roaring *lhs_map;
  uint rhs_key;
  uint lhs_key;
  const_iterator rhs_cend;
  const_iterator rhs_iter;
  const_iterator lhs_cend;
  const_iterator lhs_iter;
  map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar5;
  _Self local_38;
  _Self local_30;
  _Self local_28;
  _Self local_20 [4];
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::cbegin(in_stack_ffffffffffffff98);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::cend(in_stack_ffffffffffffff98);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::cbegin(in_stack_ffffffffffffff98);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
       ::cend(in_stack_ffffffffffffff98);
  while( true ) {
    while( true ) {
      while( true ) {
        bVar3 = std::operator!=(local_20,&local_28);
        uVar5 = false;
        if (bVar3) {
          uVar5 = std::operator!=(&local_30,&local_38);
        }
        if ((bool)uVar5 == false) {
          uVar5 = 0;
          while( true ) {
            bVar3 = std::operator!=(local_20,&local_28);
            if (!bVar3) {
              while( true ) {
                bVar3 = std::operator!=(&local_30,&local_38);
                if (!bVar3) {
                  return true;
                }
                std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
                operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>
                            *)0x114c50);
                bVar3 = Roaring::isEmpty((Roaring *)CONCAT17(uVar5,in_stack_ffffffffffffffa0));
                if (!bVar3) break;
                std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
                operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>
                            *)CONCAT17(uVar5,in_stack_ffffffffffffffa0));
              }
              return false;
            }
            std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
            operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                       0x114c0c);
            bVar3 = Roaring::isEmpty((Roaring *)CONCAT17(uVar5,in_stack_ffffffffffffffa0));
            if (!bVar3) break;
            std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
            operator++((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                       CONCAT17(uVar5,in_stack_ffffffffffffffa0));
          }
          return false;
        }
        ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
                 operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>
                             *)0x114b27);
        uVar1 = ppVar4->first;
        ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::
                 operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>
                             *)0x114b37);
        uVar2 = ppVar4->first;
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                  ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                   0x114b47);
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator->
                  ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                   0x114b5a);
        bVar3 = Roaring::isEmpty((Roaring *)CONCAT17(uVar5,in_stack_ffffffffffffffa0));
        if (!bVar3) break;
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
                  ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                   CONCAT17(uVar5,in_stack_ffffffffffffffa0));
      }
      bVar3 = Roaring::isEmpty((Roaring *)CONCAT17(uVar5,in_stack_ffffffffffffffa0));
      if (!bVar3) break;
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
                 CONCAT17(uVar5,in_stack_ffffffffffffffa0));
    }
    if (uVar1 != uVar2) {
      return false;
    }
    bVar3 = Roaring::operator==((Roaring *)CONCAT17(uVar5,in_stack_ffffffffffffffa0),
                                (Roaring *)in_stack_ffffffffffffff98);
    if (!bVar3) break;
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
               CONCAT17(uVar5,in_stack_ffffffffffffffa0));
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_unsigned_int,_roaring::Roaring>_> *)
               CONCAT17(uVar5,in_stack_ffffffffffffffa0));
  }
  return false;
}

Assistant:

bool operator==(const Roaring64Map &r) const {
        // we cannot use operator == on the map because either side may contain
        // empty Roaring Bitmaps
        auto lhs_iter = roarings.cbegin();
        auto lhs_cend = roarings.cend();
        auto rhs_iter = r.roarings.cbegin();
        auto rhs_cend = r.roarings.cend();
        while (lhs_iter != lhs_cend && rhs_iter != rhs_cend) {
            auto lhs_key = lhs_iter->first, rhs_key = rhs_iter->first;
            const auto &lhs_map = lhs_iter->second, &rhs_map = rhs_iter->second;
            if (lhs_map.isEmpty()) {
                ++lhs_iter;
                continue;
            }
            if (rhs_map.isEmpty()) {
                ++rhs_iter;
                continue;
            }
            if (!(lhs_key == rhs_key)) {
                return false;
            }
            if (!(lhs_map == rhs_map)) {
                return false;
            }
            ++lhs_iter;
            ++rhs_iter;
        }
        while (lhs_iter != lhs_cend) {
            if (!lhs_iter->second.isEmpty()) {
                return false;
            }
            ++lhs_iter;
        }
        while (rhs_iter != rhs_cend) {
            if (!rhs_iter->second.isEmpty()) {
                return false;
            }
            ++rhs_iter;
        }
        return true;
    }